

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ga_symmetr.c
# Opt level: O3

void pnga_symmetrize(Integer g_a)

{
  size_t __n;
  undefined1 auVar1 [16];
  long lVar2;
  DoublePrecision *A;
  Integer proc;
  Integer IVar3;
  logical lVar4;
  double *buf;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  double *pdVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Integer ndim;
  void *a_ptr;
  Integer alo [7];
  Integer ahi [7];
  Integer type;
  Integer bhi [7];
  Integer blo [7];
  Integer dims [7];
  Integer ldb [7];
  Integer lda [7];
  long local_208;
  int local_1fc;
  double *local_1f8;
  long local_1f0;
  Integer local_1e8 [6];
  long alStack_1b8 [2];
  Integer local_1a8;
  long local_1a0 [5];
  undefined1 auStack_178 [8];
  long local_170;
  Integer local_168 [8];
  Integer local_128 [6];
  long alStack_f8 [2];
  Integer local_e8 [8];
  Integer local_a8 [8];
  Integer local_68 [7];
  
  proc = pnga_nodeid();
  iVar9 = _ga_sync_end;
  local_1f0 = 0;
  bVar16 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar16) {
    pnga_sync();
  }
  IVar3 = pnga_total_blocks(g_a);
  pnga_inquire(g_a,&local_170,&local_208,local_e8);
  if (local_170 != 0x3ec) {
    pnga_error("ga_symmetrize: only implemented for double precision",0);
  }
  if (-1 < IVar3) {
    local_1a8 = 0x3fe0000000000000;
    lVar4 = pnga_duplicate(g_a,local_1e8,"A_transpose");
    if (lVar4 == 0) {
      pnga_error("ga_symmetrize: duplicate failed",0);
    }
    pnga_transpose(g_a,local_1e8[0]);
    pnga_add(&local_1a8,g_a,&local_1a8,local_1e8[0],g_a);
    pnga_destroy(local_1e8[0]);
    goto LAB_00164b17;
  }
  if (alStack_f8[local_208 + 1] != alStack_f8[local_208]) {
    pnga_error("ga_sym: can only sym square matrix",0);
  }
  pnga_distribution(g_a,proc,local_1e8,&local_1a8);
  bVar16 = 0 < local_1a8;
  if (1 < local_208) {
    lVar7 = 1;
    do {
      if (bVar16) {
        bVar16 = 0 < (&local_1a8)[lVar7];
      }
      else {
        bVar16 = false;
      }
      lVar7 = lVar7 + 1;
    } while (local_208 != lVar7);
  }
  if (!bVar16) {
    pnga_sync();
    goto LAB_00164b17;
  }
  pnga_access_ptr(g_a,local_1e8,&local_1a8,&local_1f0,local_68);
  lVar7 = 1;
  if (0 < local_208) {
    lVar6 = 0;
    do {
      lVar7 = lVar7 * (((&local_1a8)[lVar6] - local_1e8[lVar6]) + 1);
      lVar6 = lVar6 + 1;
    } while (local_208 != lVar6);
  }
  buf = (double *)pnga_malloc(lVar7,0x3f5,"v");
  lVar6 = local_208;
  if (2 < local_208) {
    __n = local_208 * 8 - 0x10;
    memcpy(local_168,&local_1a8,__n);
    memcpy(local_128,local_1e8,__n);
  }
  local_1fc = iVar9;
  auVar1 = *(undefined1 (*) [16])(&local_1f8 + lVar6);
  auVar17._0_8_ = auVar1._8_8_;
  auVar17._8_4_ = auVar1._0_4_;
  auVar17._12_4_ = auVar1._4_4_;
  *(undefined1 (*) [16])(local_128 + lVar6 + -2) = auVar17;
  auVar1 = *(undefined1 (*) [16])(alStack_1b8 + lVar6);
  auVar18._0_8_ = auVar1._8_8_;
  auVar18._8_4_ = auVar1._0_4_;
  auVar18._12_4_ = auVar1._4_4_;
  *(undefined1 (*) [16])(auStack_178 + lVar6 * 8) = auVar18;
  if (1 < lVar6) {
    lVar5 = 0;
    do {
      local_a8[lVar5] = (local_168[lVar5] - local_128[lVar5]) + 1;
      lVar5 = lVar5 + 1;
    } while (lVar6 + -1 != lVar5);
  }
  pnga_get(g_a,local_128,local_168,buf,local_a8);
  pnga_sync();
  lVar5 = (alStack_1b8[local_208] - (long)(&local_1f8)[local_208]) + 1;
  lVar8 = 1;
  local_1f8 = buf;
  lVar6 = lVar5;
  if (local_208 < 3) {
LAB_00164a77:
    lVar5 = ((alStack_1b8[local_208 + 1] - local_1e8[local_208 + -1]) + 1) * lVar5;
    lVar10 = 0;
    do {
      if (0 < lVar5) {
        lVar11 = 0;
        pdVar12 = buf;
        lVar13 = lVar5;
        lVar15 = lVar10;
        do {
          lVar14 = (lVar11 + 1) * lVar8 + lVar10;
          lVar2 = lVar11 + 1;
          if (lVar15 < lVar7) {
            lVar14 = lVar15;
            lVar2 = lVar11;
          }
          lVar11 = lVar2;
          *(double *)(local_1f0 + lVar14 * 8) =
               (*(double *)(local_1f0 + lVar14 * 8) + *pdVar12) * 0.5;
          lVar15 = lVar14 + lVar6;
          pdVar12 = pdVar12 + lVar8;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      lVar10 = lVar10 + 1;
      buf = buf + 1;
    } while (lVar10 != lVar8);
  }
  else {
    lVar10 = 0;
    lVar6 = 1;
    do {
      lVar11 = ((&local_1a8)[lVar10] - local_1e8[lVar10]) + 1;
      lVar6 = lVar6 * lVar11;
      lVar8 = lVar8 * lVar11;
      lVar10 = lVar10 + 1;
    } while (local_208 + -2 != lVar10);
    if (0 < lVar8) {
      lVar6 = lVar6 * lVar5;
      goto LAB_00164a77;
    }
  }
  pnga_release_update(g_a,local_1e8,&local_1a8);
  pnga_free(local_1f8);
  iVar9 = local_1fc;
LAB_00164b17:
  if (iVar9 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_symmetrize(Integer g_a) {
  
  DoublePrecision alpha = 0.5;
  Integer i, me = pnga_nodeid();
  Integer alo[GA_MAX_DIM], ahi[GA_MAX_DIM], lda[GA_MAX_DIM], nelem=1;
  Integer blo[GA_MAX_DIM], bhi[GA_MAX_DIM], ldb[GA_MAX_DIM];
  Integer ndim, dims[GA_MAX_DIM], type;
  Logical have_data;
  Integer g_b; /* temporary global array (b = A') */
  Integer num_blocks_a;
  void *a_ptr=NULL, *b_ptr=NULL;
  int local_sync_begin,local_sync_end;
  char *tempB = "A_transpose";

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  
  num_blocks_a = pnga_total_blocks(g_a);

  pnga_inquire(g_a, &type, &ndim, dims);

  if (type != C_DBL)
    pnga_error("ga_symmetrize: only implemented for double precision",0);

  if (num_blocks_a < 0) {

    if (dims[ndim-1] != dims[ndim-2]) 
      pnga_error("ga_sym: can only sym square matrix", 0L);

    /* Find the local distribution */
    pnga_distribution(g_a, me, alo, ahi);


    have_data = ahi[0]>0;
    for(i=1; i<ndim; i++) have_data = have_data && ahi[i]>0;

    if(have_data) {
      pnga_access_ptr(g_a, alo, ahi, &a_ptr, lda); 

      for(i=0; i<ndim; i++) nelem *= ahi[i]-alo[i] +1;
      b_ptr = (void *) pnga_malloc(nelem, MT_F_DBL, "v");

      for(i=0; i<ndim-2; i++) {bhi[i]=ahi[i]; blo[i]=alo[i]; }

      /* switch rows and cols */
      blo[ndim-1]=alo[ndim-2];
      bhi[ndim-1]=ahi[ndim-2];
      blo[ndim-2]=alo[ndim-1];
      bhi[ndim-2]=ahi[ndim-1];

      for (i=0; i < ndim-1; i++) 
        ldb[i] = bhi[i] - blo[i] + 1; 
      pnga_get(g_a, blo, bhi, b_ptr, ldb);
    }
    pnga_sync(); 

    if(have_data) {
      gai_add(alo, ahi, a_ptr, b_ptr, alpha, type, nelem, ndim);
      pnga_release_update(g_a, alo, ahi);
      pnga_free(b_ptr);
    }
  } else {
    /* For block-cyclic data, probably most efficient solution is to
       create duplicate copy, transpose it and add the results together */
    DoublePrecision half = 0.5;
    if (!pnga_duplicate(g_a, &g_b, tempB))
      pnga_error("ga_symmetrize: duplicate failed", 0L);
    pnga_transpose(g_a, g_b);
    pnga_add(&half, g_a, &half, g_b, g_a);
    pnga_destroy(g_b);
  }
  if(local_sync_end)pnga_sync();
}